

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_file.c
# Opt level: O1

int arg_file_scanfn(arg_file *parent,char *argval)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  
  iVar1 = parent->count;
  if (iVar1 != (parent->hdr).maxcount) {
    if (argval != (char *)0x0) {
      parent->filename[iVar1] = argval;
      pcVar3 = strrchr(argval,0x2f);
      pcVar5 = pcVar3 + 1;
      if (pcVar3 == (char *)0x0) {
        pcVar5 = argval;
      }
      iVar2 = strcmp(".",pcVar5);
      if ((iVar2 == 0) || (iVar2 = strcmp("..",pcVar5), iVar2 == 0)) {
        sVar4 = strlen(argval);
        pcVar5 = argval + sVar4;
      }
      parent->basename[iVar1] = pcVar5;
      pcVar5 = parent->basename[iVar1];
      if (pcVar5 == (char *)0x0) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = strrchr(pcVar5,0x2e);
      }
      if (pcVar3 == (char *)0x0 && pcVar5 != (char *)0x0) {
        sVar4 = strlen(pcVar5);
        pcVar3 = pcVar5 + sVar4;
      }
      if (pcVar3 == pcVar5 && pcVar5 != (char *)0x0) {
        sVar4 = strlen(pcVar5);
        pcVar3 = pcVar5 + sVar4;
      }
      if (((pcVar5 != (char *)0x0) && (pcVar3 != (char *)0x0)) &&
         (sVar4 = strlen(pcVar3), sVar4 == 1)) {
        sVar4 = strlen(pcVar5);
        pcVar3 = pcVar5 + sVar4;
      }
      parent->extension[iVar1] = pcVar3;
    }
    parent->count = iVar1 + 1;
    return 0;
  }
  return 2;
}

Assistant:

static int arg_file_scanfn(struct arg_file* parent, const char* argval) {
    int errorcode = 0;

    if (parent->count == parent->hdr.maxcount) {
        /* maximum number of arguments exceeded */
        errorcode = ARG_ERR_MAXCOUNT;
    } else if (!argval) {
        /* a valid argument with no argument value was given. */
        /* This happens when an optional argument value was invoked. */
        /* leave parent arguiment value unaltered but still count the argument. */
        parent->count++;
    } else {
        parent->filename[parent->count] = argval;
        parent->basename[parent->count] = arg_basename(argval);
        parent->extension[parent->count] =
                arg_extension(parent->basename[parent->count]); /* only seek extensions within the basename (not the file path)*/
        parent->count++;
    }

    ARG_TRACE(("%s4:scanfn(%p) returns %d\n", __FILE__, parent, errorcode));
    return errorcode;
}